

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_freeDCtx(ZSTD_DCtx *dctx)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  void *in_RDI;
  ZSTD_customMem cMem;
  ZSTD_DDictHashSet *in_stack_ffffffffffffffd0;
  undefined8 uVar1;
  void *ptr;
  undefined8 uVar2;
  undefined8 local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = 0;
  }
  else if (*(long *)((long)in_RDI + 0x75d8) == 0) {
    uVar1 = *(undefined8 *)((long)in_RDI + 0x75b0);
    ptr = *(void **)((long)in_RDI + 0x75b8);
    uVar2 = *(undefined8 *)((long)in_RDI + 0x75c0);
    ZSTD_clearDict((ZSTD_DCtx *)0x2f2dbf);
    customMem.customFree = (ZSTD_freeFunction)uVar1;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
    customMem.opaque = ptr;
    ZSTD_customFree(ptr,customMem);
    *(undefined8 *)((long)in_RDI + 0x7620) = 0;
    if (*(long *)((long)in_RDI + 0x7608) != 0) {
      customMem_01.customFree = (ZSTD_freeFunction)uVar2;
      customMem_01.customAlloc = (ZSTD_allocFunction)ptr;
      customMem_01.opaque = in_RDI;
      ZSTD_freeDDictHashSet(in_stack_ffffffffffffffd0,customMem_01);
      *(undefined8 *)((long)in_RDI + 0x7608) = 0;
    }
    customMem_00.customFree = (ZSTD_freeFunction)uVar1;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
    customMem_00.opaque = ptr;
    ZSTD_customFree(ptr,customMem_00);
    local_8 = 0;
  }
  else {
    local_8 = 0xffffffffffffffc0;
  }
  return local_8;
}

Assistant:

size_t ZSTD_freeDCtx(ZSTD_DCtx* dctx)
{
    if (dctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(dctx->staticSize, memory_allocation, "not compatible with static DCtx");
    {   ZSTD_customMem const cMem = dctx->customMem;
        ZSTD_clearDict(dctx);
        ZSTD_customFree(dctx->inBuff, cMem);
        dctx->inBuff = NULL;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (dctx->legacyContext)
            ZSTD_freeLegacyStreamContext(dctx->legacyContext, dctx->previousLegacyVersion);
#endif
        if (dctx->ddictSet) {
            ZSTD_freeDDictHashSet(dctx->ddictSet, cMem);
            dctx->ddictSet = NULL;
        }
        ZSTD_customFree(dctx, cMem);
        return 0;
    }
}